

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::FromYearMonthDayHourMinuteSecond
          (ON_wString *this,int year,int month,int mday,int hour,int minute,int second,
          ON_DateFormat date_format,ON_TimeFormat time_format,wchar_t date_separator,
          wchar_t date_time_separator,wchar_t time_separator)

{
  int iVar1;
  bool bVar2;
  wchar_t *local_e8;
  bool local_de;
  uint local_dc;
  wchar_t local_c4 [2];
  wchar_t dts [2];
  ON_wString local_b0;
  ON_wString local_a8;
  ON_wString local_a0;
  ON_wString local_98;
  ON_wString hms;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78;
  ON_wString local_70 [3];
  ON_wString local_58;
  ON_wString local_50;
  ON_wString date;
  wchar_t *ampm;
  undefined4 local_38;
  wchar_t ts [2];
  wchar_t ds [2];
  bool bValidHMS;
  bool bValidDate;
  int yday;
  int minute_local;
  int hour_local;
  int mday_local;
  int month_local;
  int year_local;
  ON_wString *result;
  
  mday_local = year;
  if (year < 0x62e) {
    mday_local = 0;
  }
  if ((mday < 1) || (minute_local = mday, 0x1f < mday)) {
    minute_local = 0;
  }
  if ((month < 1) || (hour_local = month, 0xc < month)) {
    hour_local = 0;
  }
  if (date_format == YearDayOfYear) {
    local_dc = ON_DayOfGregorianYear(mday_local,hour_local,minute_local);
  }
  else {
    local_dc = 0;
  }
  if (date_separator == L'\0') {
    date_separator = L'-';
  }
  if (date_time_separator == L'\0') {
    date_time_separator = L' ';
  }
  if (time_separator == L'\0') {
    time_separator = L':';
  }
  if (date_format == YearDayOfYear) {
    local_de = 0 < (int)local_dc;
  }
  else {
    local_de = 0 < hour_local && 0 < minute_local;
  }
  ts[0] = date_separator;
  ts[1] = L'\0';
  ampm._4_4_ = time_separator;
  local_38 = 0;
  if (hour < 0xc) {
    local_e8 = L"AM";
  }
  else {
    local_e8 = L"PM";
  }
  date.m_s = local_e8;
  ON_wString(&local_50);
  switch(date_format) {
  case Unset:
    local_de = true;
    break;
  case Omit:
    local_de = true;
    break;
  case YearMonthDay:
    FormatToString((wchar_t *)&local_58,L"%d%ls%d%ls%d",(ulong)(uint)mday_local,ts,
                   (ulong)(uint)hour_local,ts,minute_local);
    operator=(&local_50,&local_58);
    ~ON_wString(&local_58);
    break;
  case YearDayMonth:
    FormatToString((wchar_t *)local_70,L"%d%ls%d%ls%d",(ulong)(uint)mday_local,ts,
                   (ulong)(uint)minute_local,ts,hour_local);
    operator=(&local_50,local_70);
    ~ON_wString(local_70);
    break;
  case MonthDayYear:
    FormatToString((wchar_t *)&local_78,L"%d%ls%d%ls%d",(ulong)(uint)hour_local,ts,
                   (ulong)(uint)minute_local,ts,mday_local);
    operator=(&local_50,&local_78);
    ~ON_wString(&local_78);
    break;
  case DayMonthYear:
    FormatToString((wchar_t *)&local_80,L"%d%ls%d%ls%d",(ulong)(uint)minute_local,ts,
                   (ulong)(uint)hour_local,ts,mday_local);
    operator=(&local_50,&local_80);
    ~ON_wString(&local_80);
    break;
  case YearDayOfYear:
    FormatToString((wchar_t *)&local_88,L"%d%ls%d",(ulong)(uint)mday_local,ts,(ulong)local_dc);
    operator=(&local_50,&local_88);
    ~ON_wString(&local_88);
  }
  if (local_de) {
    ON_wString(&local_98);
    if (time_format < (HourMinute24|HourMinute12)) {
      iVar1 = hour >> 0x1f;
      switch(time_format) {
      case Unset:
        break;
      case Omit:
        break;
      case HourMinute12:
        FormatToString((wchar_t *)&local_a0,L"%02d%ls%02d%ls",
                       (ulong)(hour + (((uint)(hour / 6 + iVar1) >> 1) - iVar1) * -0xc),
                       (long)&ampm + 4,(ulong)(uint)minute,date.m_s);
        operator=(&local_98,&local_a0);
        ~ON_wString(&local_a0);
        break;
      case HourMinuteSecond12:
        FormatToString((wchar_t *)&local_a8,L"%02d%ls%02d%ls%02d%ls",
                       (ulong)(hour + (((uint)(hour / 6 + iVar1) >> 1) - iVar1) * -0xc),
                       (long)&ampm + 4,(ulong)(uint)minute,(long)&ampm + 4,second,date.m_s);
        operator=(&local_98,&local_a8);
        ~ON_wString(&local_a8);
        break;
      case HourMinute24:
        FormatToString((wchar_t *)&local_b0,L"%02d%ls%02d",(ulong)(uint)hour,(long)&ampm + 4,
                       (ulong)(uint)minute);
        operator=(&local_98,&local_b0);
        ~ON_wString(&local_b0);
        break;
      case HourMinuteSecond24:
        FormatToString(dts + 1,L"%02d%ls%02d%ls%02d",(ulong)(uint)hour,(long)&ampm + 4,
                       (ulong)(uint)minute,(long)&ampm + 4,second);
        operator=(&local_98,(ON_wString *)(dts + 1));
        ~ON_wString((ON_wString *)(dts + 1));
      }
    }
    dts[0]._3_1_ = 0;
    ON_wString(this,&local_50);
    bVar2 = IsNotEmpty(this);
    if ((bVar2) && (bVar2 = IsNotEmpty(&local_98), bVar2)) {
      local_c4[0] = date_time_separator;
      local_c4[1] = 0;
      operator+=(this,local_c4);
    }
    operator+=(this,&local_98);
    hms.m_s._4_4_ = 1;
    dts[0]._3_1_ = 1;
    ~ON_wString(&local_98);
  }
  else {
    ON_wString(this,&EmptyString);
    hms.m_s._4_4_ = 1;
  }
  ~ON_wString(&local_50);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromYearMonthDayHourMinuteSecond(
  int year,
  int month,
  int mday,
  int hour,
  int minute,
  int second,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  if (year < 1582)
    year = 0;

  if (mday < 1 || mday > 31)
    mday = 0;

  if (month < 1 || month > 12)
    month = 0;

  const int yday
    = (ON_DateFormat::YearDayOfYear == date_format)
    ? ON_DayOfGregorianYear(year, month, mday)
    : 0;

  if (0 == date_separator)
    date_separator = ON_wString::HyphenMinus;
  if (0 == date_time_separator)
    date_time_separator = ON_wString::Space;
  if (0 == time_separator)
    time_separator = ':';
  
  bool bValidDate 
    = ON_DateFormat::YearDayOfYear == date_format
    ? (yday > 0)
    : (month > 0 && mday > 0);
  bool bValidHMS = (hour >= 0 && minute >= 0 && second >= 0 && hour < 24 && minute <= 59 && second <= 59);


  const wchar_t ds[2] = { date_separator, 0 };
  const wchar_t ts[2] = { time_separator, 0 };
  const wchar_t* ampm = (hour >= 12) ? L"PM" : L"AM";
  
  ON_wString date;
  switch (date_format)
  {
  case ON_DateFormat::Unset:
    bValidDate = true;
    break;
  case ON_DateFormat::Omit:
    bValidDate = true;
    break;
  case ON_DateFormat::YearMonthDay:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, month, ds, mday);
    break;
  case ON_DateFormat::YearDayMonth:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, mday, ds, month);
    break;
  case ON_DateFormat::MonthDayYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", month, ds, mday, ds, year);
    break;
  case ON_DateFormat::DayMonthYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", mday, ds, month, ds, year);
    break;
  case ON_DateFormat::YearDayOfYear:
    date = ON_wString::FormatToString(L"%d%ls%d", year, ds, yday);
    break;
  default:
    break;
  }
  if (false == bValidDate)
    return ON_wString::EmptyString;
  
  ON_wString hms;
  switch (time_format)
  {
  case ON_TimeFormat::Unset:
    bValidHMS = true;
    break;
  case ON_TimeFormat::Omit:
    bValidHMS = true;
    break;
  case ON_TimeFormat::HourMinute12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls", hour%12, ts, minute, ampm);
    break;
  case ON_TimeFormat::HourMinuteSecond12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d%ls", hour%12, ts, minute, ts, second, ampm);
    break;
  case ON_TimeFormat::HourMinute24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d", hour, ts, minute);
    break;
  case ON_TimeFormat::HourMinuteSecond24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d", hour, ts, minute, ts, second);
    break;
  default:
    break;
  }

  ON_wString result = date;
  if (result.IsNotEmpty() && hms.IsNotEmpty())
  {
    const wchar_t dts[] = { date_time_separator,0 };
    result += dts;
  }
  result += hms;

  return result;
}